

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O3

void __thiscall libtorrent::aux::torrent::set_paused(torrent *this,bool b,pause_flags_t flags)

{
  ulong uVar1;
  ulong uVar2;
  pause_flags_t pVar3;
  bool was_paused;
  
  pVar3.m_val = 0;
  if ((int)((ulong)((long)(this->super_torrent_hot_members).m_connections.
                          super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                          .
                          super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->super_torrent_hot_members).m_connections.
                         super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                         .
                         super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 3) !=
      (int)((ulong)((long)(this->m_peers_to_disconnect).
                          super__Vector_base<std::shared_ptr<libtorrent::aux::peer_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->m_peers_to_disconnect).
                         super__Vector_base<std::shared_ptr<libtorrent::aux::peer_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 4)) {
    pVar3.m_val = flags.m_val;
  }
  uVar1 = *(ulong *)&(this->super_torrent_hot_members).field_0x48;
  if ((((uint)uVar1 >> 0x1b & 1) == 0) == b) {
    uVar2 = uVar1 & 0xfffffffff7ffffff | (ulong)((uint)b << 0x1b);
    *(ulong *)&(this->super_torrent_hot_members).field_0x48 = uVar2;
    if (((uVar1 & 0x18000000) != 0) == ((uVar2 & 0x18000000) != 0)) {
      return;
    }
    *(ulong *)&(this->super_torrent_hot_members).field_0x48 =
         uVar2 & 0xffffffff7fffffff | (ulong)((uint)pVar3.m_val << 0x1f);
    if (!b) {
      do_resume(this);
      return;
    }
    was_paused = false;
  }
  else {
    if (((~(uint)uVar1 & 0x88000000) != 0) || ((pVar3.m_val & 1) != 0)) {
      return;
    }
    *(ulong *)&(this->super_torrent_hot_members).field_0x48 = uVar1 & 0xffffffff7fffffff;
    update_gauge(this);
    was_paused = true;
  }
  do_pause(this,was_paused);
  return;
}

Assistant:

void torrent::set_paused(bool const b, pause_flags_t flags)
	{
		TORRENT_ASSERT(is_single_thread());

		// if there are no peers, there is no point in a graceful pause mode. In
		// fact, the promise to post the torrent_paused_alert exactly once is
		// maintained by the last peer to be disconnected in graceful pause mode,
		// if there are no peers, we must not enter graceful pause mode, and post
		// the torrent_paused_alert immediately instead.
		if (num_peers() == 0)
			flags &= ~torrent_handle::graceful_pause;

		if (m_paused == b)
		{
			// there is one special case here. If we are
			// currently in graceful pause mode, and we just turned into regular
			// paused mode, we need to actually pause the torrent properly
			if (m_paused == true
				&& m_graceful_pause_mode == true
				&& !(flags & torrent_handle::graceful_pause))
			{
				m_graceful_pause_mode = false;
				update_gauge();
				do_pause(true);
			}
			return;
		}

		bool const paused_before = is_paused();

		m_paused = b;

		// the session may still be paused, in which case
		// the effective state of the torrent did not change
		if (paused_before == is_paused()) return;

		m_graceful_pause_mode = bool(flags & torrent_handle::graceful_pause);

		if (b) do_pause();
		else do_resume();
	}